

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O2

void ggml_compute_forward_step(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  ggml_tensor *src0;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  FILE *__stream;
  char cVar13;
  ggml_bf16_t gVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int64_t ir;
  long lVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  int64_t ir_2;
  undefined1 auVar24 [16];
  pair<long,_long> pVar25;
  undefined8 uStack_90;
  long local_60;
  
  __stream = _stderr;
  src0 = dst->src[0];
  gVar1 = dst->type;
  gVar2 = src0->type;
  if (gVar2 == GGML_TYPE_BF16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) {
LAB_00128fe9:
          pcVar21 = "nb0 == sizeof(dst_t)";
          uStack_90 = 0x55;
          goto LAB_00129019;
        }
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[1];
          sVar4 = src0->nb[2];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          sVar6 = dst->nb[1];
          sVar8 = dst->nb[3];
          sVar9 = src0->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[2];
          pVar25 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar25.first; lVar20 < pVar25.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              uVar18 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT216(*(ushort *)
                                               ((long)pvVar12 +
                                               uVar17 * 2 +
                                               lVar22 * sVar3 + lVar15 * sVar9 + lVar16 * sVar4)) <<
                                      0x10,1);
              *(uint *)((long)pvVar11 +
                       uVar17 * 4 + lVar22 * sVar6 + lVar15 * sVar8 + lVar16 * sVar10) =
                   (uint)((byte)uVar18 & 1) * 0x3f800000;
            }
          }
          return;
        }
LAB_00129002:
        pcVar21 = "nb00 == sizeof(src0_t)";
        uStack_90 = 0x56;
        goto LAB_00129019;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_BF16) goto LAB_00128f98;
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00128fe9;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[1];
          sVar4 = src0->nb[2];
          sVar6 = src0->nb[3];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar25 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          while( true ) {
            local_60 = pVar25.second;
            lVar20 = pVar25.first;
            if (local_60 <= lVar20) break;
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = src0->data;
            pvVar12 = dst->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              uVar18 = vcmpss_avx512f(ZEXT216(*(ushort *)
                                               ((long)pvVar11 +
                                               uVar17 * 2 +
                                               lVar22 * sVar3 + lVar15 * sVar6 + lVar16 * sVar4)) <<
                                      0x10,ZEXT416(0),0xe);
              gVar14 = f32_to_bf16((float)((uint)((byte)uVar18 & 1) * 0x3f800000));
              *(uint16_t *)
               ((long)pvVar12 + uVar17 * 2 + lVar22 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) =
                   gVar14.bits;
            }
            pVar25.second = local_60;
            pVar25.first = lVar20 + 1;
          }
          return;
        }
        goto LAB_00129002;
      }
    }
  }
  else if (gVar2 == GGML_TYPE_F16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_00128fe9;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          sVar8 = dst->nb[2];
          sVar9 = dst->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[1];
          pVar25 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar25.first; lVar20 < pVar25.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              uVar18 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar12 +
                                                               uVar17 * 2 +
                                                               lVar22 * sVar6 + lVar15 * sVar4 +
                                                               lVar16 * sVar3) * 4)),1);
              *(uint *)((long)pvVar11 +
                       uVar17 * 4 + lVar22 * sVar10 + lVar15 * sVar9 + lVar16 * sVar8) =
                   (uint)((byte)uVar18 & 1) * 0x3f800000;
            }
          }
          return;
        }
        goto LAB_00129002;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto LAB_00128f98;
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00128fe9;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          uVar7 = dst->ne[0];
          pVar25 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar25.first; lVar20 < pVar25.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 % lVar23;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              uVar18 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)src0->data +
                                                               uVar17 * 2 +
                                                               (lVar15 % lVar5) * sVar6 +
                                                               (lVar20 / lVar23) * sVar4 +
                                                               (lVar15 / lVar5) * sVar3) * 4)),1);
              auVar24 = vcvtps2ph_f16c(ZEXT416((uint)((byte)uVar18 & 1) * 0x3f800000),0);
              vpextrw_avx(auVar24,0);
            }
          }
          return;
        }
        goto LAB_00129002;
      }
    }
  }
  else {
    if ((gVar2 != GGML_TYPE_F32) || (gVar1 != GGML_TYPE_F32)) {
LAB_00128f98:
      uVar18 = ggml_type_name();
      uVar19 = ggml_type_name(src0->type);
      fprintf(__stream,"%s: unsupported types: dst: %s, src0: %s\n","unary_op",uVar18,uVar19);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                 ,0x78,"fatal error");
    }
    cVar13 = ggml_is_contiguous_1(src0);
    if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
       (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_00128fe9;
      if (src0->nb[0] == 4) {
        sVar3 = src0->nb[1];
        sVar4 = src0->nb[2];
        lVar5 = src0->ne[1];
        lVar23 = src0->ne[2];
        sVar6 = src0->nb[3];
        uVar7 = dst->ne[0];
        sVar8 = dst->nb[1];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        pVar25 = get_thread_range(params,src0);
        lVar23 = lVar23 * lVar5;
        for (lVar20 = pVar25.first; lVar20 < pVar25.second; lVar20 = lVar20 + 1) {
          lVar15 = lVar20 / lVar23;
          lVar22 = lVar20 % lVar23;
          lVar16 = lVar22 / lVar5;
          lVar22 = lVar22 % lVar5;
          pvVar11 = dst->data;
          pvVar12 = src0->data;
          for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
            uVar18 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                    ZEXT416(*(uint *)((long)pvVar12 +
                                                     uVar17 * 4 +
                                                     lVar22 * sVar3 + lVar15 * sVar6 +
                                                     lVar16 * sVar4)),1);
            *(uint *)((long)pvVar11 + uVar17 * 4 + lVar22 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9
                     ) = (uint)((byte)uVar18 & 1) * 0x3f800000;
          }
        }
        return;
      }
      goto LAB_00129002;
    }
  }
  pcVar21 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uStack_90 = 0x51;
LAB_00129019:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uStack_90,"GGML_ASSERT(%s) failed",pcVar21);
}

Assistant:

void ggml_compute_forward_step(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_step>(params, dst);
}